

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseMemoryBinaryExpr<wabt::MemoryBinaryExpr<(wabt::ExprType)28>>
          (WastParser *this,Location loc,
          unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  bool bVar1;
  MemoryBinaryExpr<(wabt::ExprType)28> *this_00;
  Var local_190;
  Var local_148;
  size_t local_100;
  char *local_f8;
  size_t local_f0;
  undefined8 local_e8;
  Enum local_e0;
  undefined4 local_dc;
  size_t local_d8;
  char *local_d0;
  size_t local_c8;
  undefined8 local_c0;
  Enum local_b4;
  undefined1 local_b0 [8];
  Var srcmemidx;
  Var destmemidx;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr_local;
  WastParser *this_local;
  
  Var::Var((Var *)((long)&srcmemidx.field_2 + 0x18));
  Var::Var((Var *)local_b0);
  local_d8 = loc.filename._M_len;
  local_d0 = loc.filename._M_str;
  local_c8 = (size_t)loc.field_1.field_1.offset;
  local_c0 = loc.field_1._8_8_;
  local_b4 = (Enum)ParseMemidx(this,loc,(Var *)((long)&srcmemidx.field_2 + 0x18));
  bVar1 = Failed((Result)local_b4);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    local_100 = loc.filename._M_len;
    local_f8 = loc.filename._M_str;
    local_f0 = (size_t)loc.field_1.field_1.offset;
    local_e8 = loc.field_1._8_8_;
    local_e0 = (Enum)ParseMemidx(this,loc,(Var *)local_b0);
    bVar1 = Failed((Result)local_e0);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      this_00 = (MemoryBinaryExpr<(wabt::ExprType)28> *)operator_new(0xd0);
      Var::Var(&local_148,(Var *)((long)&srcmemidx.field_2 + 0x18));
      Var::Var(&local_190,(Var *)local_b0);
      MemoryBinaryExpr<(wabt::ExprType)28>::MemoryBinaryExpr(this_00,&local_148,&local_190,&loc);
      std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
                (out_expr,(pointer)this_00);
      Var::~Var(&local_190);
      Var::~Var(&local_148);
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  local_dc = 1;
  Var::~Var((Var *)local_b0);
  Var::~Var((Var *)((long)&srcmemidx.field_2 + 0x18));
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseMemoryBinaryExpr(Location loc,
                                         std::unique_ptr<Expr>* out_expr) {
  Var destmemidx;
  Var srcmemidx;
  CHECK_RESULT(ParseMemidx(loc, &destmemidx));
  CHECK_RESULT(ParseMemidx(loc, &srcmemidx));
  out_expr->reset(new T(destmemidx, srcmemidx, loc));
  return Result::Ok;
}